

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDecoder.cpp
# Opt level: O1

int ZXing::Pdf417::TextCompaction
              (vector<int,_std::allocator<int>_> *codewords,int codeIndex,Content *result)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  value_type_conflict3 length;
  uint8_t val;
  int iVar4;
  long *plVar5;
  bool bVar6;
  long lVar7;
  uint uVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  int index;
  vector<int,_std::allocator<int>_> textCompactionData;
  value_type_conflict3 local_70;
  allocator_type local_69;
  vector<int,_std::allocator<int>_> local_68;
  uint *local_50;
  undefined8 local_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  local_70 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_68,
             ((long)*(codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start - (long)codeIndex) * 2,&local_70,&local_69);
  local_70 = 0;
  piVar9 = (codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (codeIndex < *piVar9) {
    bVar3 = false;
    do {
      iVar4 = codeIndex + 1;
      iVar11 = piVar9[codeIndex];
      if (iVar11 < 900) {
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_70] = iVar11 / 0x1e;
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(long)local_70 + 1] = iVar11 % 0x1e;
        local_70 = local_70 + 2;
        codeIndex = iVar4;
        bVar6 = bVar3;
      }
      else {
        uVar8 = iVar11 - 900;
        if (0x1c < uVar8) {
LAB_001710b2:
          plVar5 = (long *)__cxa_allocate_exception(0x30);
          local_50 = &local_40;
          uVar8 = local_40 >> 8;
          local_40 = uVar8 << 8;
          *plVar5 = (long)(plVar5 + 2);
          *(uint *)(plVar5 + 2) = local_40;
          *(undefined4 *)((long)plVar5 + 0x14) = uStack_3c;
          *(undefined4 *)(plVar5 + 3) = uStack_38;
          *(undefined4 *)((long)plVar5 + 0x1c) = uStack_34;
          plVar5[1] = 0;
          local_48 = 0;
          local_40 = uVar8 << 8;
          plVar5[4] = (long)"src/pdf417/PDFDecoder.cpp";
          *(undefined2 *)(plVar5 + 5) = 0x125;
          *(undefined1 *)((long)plVar5 + 0x2a) = 1;
          __cxa_throw(plVar5,&Error::typeinfo,Error::~Error);
        }
        bVar6 = true;
        if ((0x11c00007U >> (uVar8 & 0x1f) & 1) == 0) {
          if ((0xe000000U >> (uVar8 & 0x1f) & 1) == 0) {
            if (uVar8 != 0xd) goto LAB_001710b2;
            lVar7 = (long)local_70;
            local_70 = local_70 + 1;
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar7] = 0x391;
            piVar9 = (codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            bVar2 = iVar4 < *piVar9;
            codeIndex = iVar4;
            bVar6 = bVar3;
            if (iVar4 < *piVar9) {
              iVar11 = piVar9[iVar4];
              while (iVar11 - 0x39dU < 3) {
                codeIndex = ProcessTextECI(&local_68,&local_70,codewords,codeIndex + 1,iVar11);
                piVar9 = (codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                bVar2 = codeIndex < *piVar9;
                if (*piVar9 <= codeIndex) goto LAB_00170d85;
                iVar11 = piVar9[codeIndex];
              }
              if (bVar2) {
                lVar7 = (long)codeIndex;
                codeIndex = codeIndex + 1;
                lVar10 = (long)local_70;
                local_70 = local_70 + 1;
                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10] = piVar9[lVar7];
              }
            }
          }
          else {
            codeIndex = ProcessTextECI(&local_68,&local_70,codewords,iVar4,iVar11);
            bVar6 = bVar3;
          }
        }
      }
LAB_00170d85:
      piVar9 = (codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while ((codeIndex < *piVar9) && (bVar3 = bVar6, !bVar6));
  }
  length = local_70;
  if (0 < local_70) {
    iVar11 = 0;
    iVar4 = 0;
    do {
      iVar1 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar4];
      if (iVar1 - 0x39dU < 3) {
        iVar4 = ProcessECI(&local_68,iVar4 + 1,length,iVar1,result);
      }
      else if (iVar1 == 0x391) {
        for (iVar4 = iVar4 + 1; iVar4 < length;
            iVar4 = ProcessECI(&local_68,iVar4,length,iVar1,result)) {
          iVar1 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar4];
          iVar4 = iVar4 + 1;
          if (2 < iVar1 - 0x39dU) {
            Content::push_back(result,(uint8_t)iVar1);
            break;
          }
        }
      }
      else {
        if (iVar1 < 0x1a) {
          val = (iVar11 != 0) * ' ' + (char)iVar1 + 'A';
        }
        else {
          val = ' ';
          if (iVar1 != 0x1a) {
            if ((iVar1 == 0x1b) && (iVar11 == 0)) {
              val = '\0';
              iVar11 = 1;
            }
            else if ((iVar1 == 0x1b) && (iVar11 == 1)) {
              val = '\0';
              iVar11 = 4;
            }
            else {
              if (iVar1 == 0x1c) {
                iVar11 = 2;
              }
              else if ((iVar4 + 1 < length) &&
                      (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar4 + 1] != 0x391)) {
                iVar11 = 5;
              }
              val = '\0';
            }
          }
        }
        if (val != '\0') {
          Content::push_back(result,val);
        }
        iVar4 = iVar4 + 1;
      }
    } while (iVar4 < length);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return codeIndex;
}

Assistant:

static int TextCompaction(const std::vector<int>& codewords, int codeIndex, Content& result)
{
	// 2 characters per codeword
	std::vector<int> textCompactionData((codewords[0] - codeIndex) * 2, 0);

	int index = 0;
	bool end = false;

	while ((codeIndex < codewords[0]) && !end) {
		int code = codewords[codeIndex++];
		if (code < TEXT_COMPACTION_MODE_LATCH) {
			textCompactionData[index] = code / 30;
			textCompactionData[index + 1] = code % 30;
			index += 2;
		} else {
			switch (code) {
			case MODE_SHIFT_TO_BYTE_COMPACTION_MODE:
				// The Mode Shift codeword 913 shall cause a temporary
				// switch from Text Compaction mode to Byte Compaction mode.
				// This switch shall be in effect for only the next codeword,
				// after which the mode shall revert to the prevailing sub-mode
				// of the Text Compaction mode. Codeword 913 is only available
				// in Text Compaction mode; its use is described in 5.4.2.4.
				textCompactionData[index++] = MODE_SHIFT_TO_BYTE_COMPACTION_MODE;
				// 5.5.3.1 allows ECIs anywhere in Text Compaction, including after a Shift to Byte
				while (codeIndex < codewords[0] && IsECI(codewords[codeIndex])) {
					codeIndex = ProcessTextECI(textCompactionData, index, codewords, codeIndex + 1, codewords[codeIndex]);
				}
				if (codeIndex < codewords[0])
					textCompactionData[index++] = codewords[codeIndex++]; // Byte to shift
				break;
			case ECI_CHARSET:
			case ECI_GENERAL_PURPOSE:
			case ECI_USER_DEFINED:
				codeIndex = ProcessTextECI(textCompactionData, index, codewords, codeIndex, code);
				break;
			default:
				if (!TerminatesCompaction(code))
					throw FormatError();

				codeIndex--;
				end = true;
				break;
			}
		}
	}
	DecodeTextCompaction(textCompactionData, index, result);
	return codeIndex;
}